

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::
StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::FlushPageState(StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                 *this,WriteStream *temp_writer,ColumnWriterPageState *state_p)

{
  Allocator *pAVar1;
  InternalException *this_00;
  anon_union_16_2_67f50693_for_value local_48;
  char local_38 [24];
  
  switch(*(undefined4 *)&state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Unknown encoding","");
    InternalException::InternalException(this_00,(string *)&local_48.pointer);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 5:
    if (*(char *)((long)&state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
      local_48._0_8_ = 0;
      DbpEncoder::BeginWriteInternal((DbpEncoder *)(state_p + 2),temp_writer,(int64_t *)&local_48);
    }
    DbpEncoder::FinishWrite((DbpEncoder *)(state_p + 2),temp_writer);
    break;
  case 6:
    if (*(char *)&state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
      pAVar1 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      local_48._0_8_ = 0;
      local_48.pointer.ptr = (char *)0x0;
      DlbaEncoder::BeginWrite<duckdb::string_t>
                ((DlbaEncoder *)(state_p + 0x909),pAVar1,temp_writer,(string_t *)&local_48.pointer);
    }
    DlbaEncoder::FinishWrite((DlbaEncoder *)(state_p + 0x909),temp_writer);
    break;
  case 8:
    if (*(char *)&state_p[0x121c]._vptr_ColumnWriterPageState != '\0') {
      RleBpEncoder::WriteRun((RleBpEncoder *)(state_p + 0x121d),temp_writer);
      return;
    }
    local_48.pointer.length._0_1_ =
         *(undefined1 *)((long)&state_p[0x121c]._vptr_ColumnWriterPageState + 4);
    (**temp_writer->_vptr_WriteStream)(temp_writer,&local_48,1);
    break;
  case 9:
    if (*(char *)&state_p[0x1214]._vptr_ColumnWriterPageState == '\0') {
      pAVar1 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      BssEncoder::BeginWrite((BssEncoder *)(state_p + 0x1215),pAVar1);
    }
    (**temp_writer->_vptr_WriteStream)
              (temp_writer,state_p[0x1219]._vptr_ColumnWriterPageState,
               (long)state_p[0x1216]._vptr_ColumnWriterPageState *
               (long)state_p[0x1215]._vptr_ColumnWriterPageState);
    return;
  }
  return;
}

Assistant:

void FlushPageState(WriteStream &temp_writer, ColumnWriterPageState *state_p) override {
		auto &page_state = state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();
		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED:
			if (!page_state.dbp_initialized) {
				page_state.dbp_encoder.BeginWrite(temp_writer, 0);
			}
			page_state.dbp_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::RLE_DICTIONARY:
			D_ASSERT(page_state.dict_bit_width != 0);
			if (!page_state.dict_written_value) {
				// all values are null
				// just write the bit width
				temp_writer.Write<uint8_t>(page_state.dict_bit_width);
				return;
			}
			page_state.dict_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY:
			if (!page_state.dlba_initialized) {
				page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
				                                   string_t(""));
			}
			page_state.dlba_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT:
			if (!page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
			}
			page_state.bss_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::PLAIN:
			break;
		default:
			throw InternalException("Unknown encoding");
		}
	}